

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::avx512::ConeCurveMiIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  Scene *pSVar13;
  Geometry *pGVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  ulong uVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  ulong uVar79;
  undefined1 auVar80 [8];
  bool bVar81;
  bool bVar82;
  byte bVar83;
  byte bVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar88 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [32];
  undefined1 auVar138 [64];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [64];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  int iVar161;
  int iVar162;
  int iVar163;
  int iVar164;
  int iVar165;
  int iVar166;
  int iVar167;
  int iVar168;
  undefined1 in_ZMM21 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined1 local_5a0 [16];
  RayK<4> *local_588;
  undefined4 local_57c;
  Primitive *local_578;
  RTCFilterFunctionNArguments local_570;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [16];
  RTCHitN local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  uint local_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  uint local_3e0 [4];
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar148 [64];
  
  pSVar13 = context->scene;
  pGVar14 = (pSVar13->geometries).items[line->sharedGeomID].ptr;
  uVar5 = (line->v0).field_0.i[0];
  lVar15 = *(long *)&pGVar14[1].time_range.upper;
  p_Var16 = pGVar14[1].intersectionFilterN;
  uVar6 = (line->v0).field_0.i[1];
  uVar7 = (line->v0).field_0.i[2];
  uVar8 = (line->v0).field_0.i[3];
  uVar9 = (line->v0).field_0.i[4];
  auVar100._16_16_ = *(undefined1 (*) [16])(lVar15 + (ulong)uVar9 * (long)p_Var16);
  auVar100._0_16_ = *(undefined1 (*) [16])(lVar15 + (ulong)uVar5 * (long)p_Var16);
  uVar10 = (line->v0).field_0.i[5];
  auVar123._16_16_ = *(undefined1 (*) [16])(lVar15 + (ulong)uVar10 * (long)p_Var16);
  auVar123._0_16_ = *(undefined1 (*) [16])(lVar15 + (ulong)uVar6 * (long)p_Var16);
  uVar11 = (line->v0).field_0.i[6];
  auVar105._16_16_ = *(undefined1 (*) [16])(lVar15 + (ulong)uVar11 * (long)p_Var16);
  auVar105._0_16_ = *(undefined1 (*) [16])(lVar15 + (ulong)uVar7 * (long)p_Var16);
  uVar12 = (line->v0).field_0.i[7];
  auVar101._16_16_ = *(undefined1 (*) [16])(lVar15 + (ulong)uVar12 * (long)p_Var16);
  auVar101._0_16_ = *(undefined1 (*) [16])(lVar15 + (ulong)uVar8 * (long)p_Var16);
  auVar88 = *(undefined1 (*) [16])(lVar15 + (ulong)(uVar9 + 1) * (long)p_Var16);
  auVar111._0_16_ =
       ZEXT116(0) * auVar88 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar15 + (ulong)(uVar5 + 1) * (long)p_Var16);
  auVar111._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar88;
  auVar88 = *(undefined1 (*) [16])(lVar15 + (ulong)(uVar10 + 1) * (long)p_Var16);
  auVar116._0_16_ =
       ZEXT116(0) * auVar88 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar15 + (ulong)(uVar6 + 1) * (long)p_Var16);
  auVar116._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar88;
  auVar88 = *(undefined1 (*) [16])(lVar15 + (ulong)(uVar11 + 1) * (long)p_Var16);
  auVar112._0_16_ =
       ZEXT116(0) * auVar88 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar15 + (ulong)(uVar7 + 1) * (long)p_Var16);
  auVar112._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar88;
  auVar88 = *(undefined1 (*) [16])(lVar15 + (ulong)(uVar12 + 1) * (long)p_Var16);
  auVar91._0_16_ =
       ZEXT116(0) * auVar88 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar15 + (ulong)(uVar8 + 1) * (long)p_Var16);
  auVar91._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar88;
  local_100 = vpbroadcastd_avx512vl();
  auVar97 = vunpcklps_avx(auVar100,auVar105);
  auVar95 = vunpckhps_avx(auVar100,auVar105);
  auVar100 = vunpcklps_avx(auVar123,auVar101);
  auVar96 = vunpckhps_avx(auVar123,auVar101);
  auVar105 = vunpcklps_avx(auVar97,auVar100);
  auVar100 = vunpckhps_avx(auVar97,auVar100);
  auVar101 = vunpcklps_avx(auVar95,auVar96);
  auVar123 = vunpckhps_avx(auVar95,auVar96);
  auVar97 = vpunpckldq_avx2(auVar111,auVar112);
  auVar95 = vpunpckhdq_avx2(auVar111,auVar112);
  auVar111 = vpunpckldq_avx2(auVar116,auVar91);
  auVar96 = vpunpckhdq_avx2(auVar116,auVar91);
  auVar116 = vpunpckldq_avx2(auVar97,auVar111);
  auVar111 = vpunpckhdq_avx2(auVar97,auVar111);
  auVar112 = vpunpckldq_avx2(auVar95,auVar96);
  auVar91 = vpunpckhdq_avx512vl(auVar95,auVar96);
  auVar95 = vpcmpeqd_avx2(auVar97,auVar97);
  uVar71 = vpcmpd_avx512vl(auVar95,(undefined1  [32])(line->primIDs).field_0,4);
  fVar1 = *(float *)(ray + k * 4);
  auVar99._4_4_ = fVar1;
  auVar99._0_4_ = fVar1;
  auVar99._8_4_ = fVar1;
  auVar99._12_4_ = fVar1;
  auVar99._16_4_ = fVar1;
  auVar99._20_4_ = fVar1;
  auVar99._24_4_ = fVar1;
  auVar99._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x10);
  auVar102._4_4_ = fVar2;
  auVar102._0_4_ = fVar2;
  auVar102._8_4_ = fVar2;
  auVar102._12_4_ = fVar2;
  auVar102._16_4_ = fVar2;
  auVar102._20_4_ = fVar2;
  auVar102._24_4_ = fVar2;
  auVar102._28_4_ = fVar2;
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar103._4_4_ = uVar3;
  auVar103._0_4_ = uVar3;
  auVar103._8_4_ = uVar3;
  auVar103._12_4_ = uVar3;
  auVar103._16_4_ = uVar3;
  auVar103._20_4_ = uVar3;
  auVar103._24_4_ = uVar3;
  auVar103._28_4_ = uVar3;
  auVar92 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar169 = ZEXT3264(auVar92);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar170 = ZEXT3264(auVar93);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar171 = ZEXT3264(auVar94);
  auVar88 = vmulss_avx512f(auVar94._0_16_,auVar94._0_16_);
  auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar93,auVar93);
  auVar95 = vfmadd231ps_avx512vl(auVar95,auVar92,auVar92);
  auVar97._0_4_ = auVar95._0_4_;
  auVar97._4_4_ = auVar97._0_4_;
  auVar97._8_4_ = auVar97._0_4_;
  auVar97._12_4_ = auVar97._0_4_;
  auVar97._16_4_ = auVar97._0_4_;
  auVar97._20_4_ = auVar97._0_4_;
  auVar97._24_4_ = auVar97._0_4_;
  auVar97._28_4_ = auVar97._0_4_;
  auVar96 = vrcp14ps_avx512vl(auVar97);
  auVar89 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar95._8_4_ = 0x3f800000;
  auVar95._0_8_ = &DAT_3f8000003f800000;
  auVar95._12_4_ = 0x3f800000;
  auVar95._16_4_ = 0x3f800000;
  auVar95._20_4_ = 0x3f800000;
  auVar95._24_4_ = 0x3f800000;
  auVar95._28_4_ = 0x3f800000;
  auVar95 = vfnmadd213ps_avx512vl(auVar97,auVar96,auVar95);
  auVar88 = vfmadd132ps_fma(auVar95,auVar96,auVar96);
  auVar98._0_4_ = auVar105._0_4_ + auVar116._0_4_;
  auVar98._4_4_ = auVar105._4_4_ + auVar116._4_4_;
  auVar98._8_4_ = auVar105._8_4_ + auVar116._8_4_;
  auVar98._12_4_ = auVar105._12_4_ + auVar116._12_4_;
  auVar98._16_4_ = auVar105._16_4_ + auVar116._16_4_;
  auVar98._20_4_ = auVar105._20_4_ + auVar116._20_4_;
  auVar98._24_4_ = auVar105._24_4_ + auVar116._24_4_;
  auVar98._28_4_ = auVar105._28_4_ + auVar116._28_4_;
  auVar104._0_4_ = auVar111._0_4_ + auVar100._0_4_;
  auVar104._4_4_ = auVar111._4_4_ + auVar100._4_4_;
  auVar104._8_4_ = auVar111._8_4_ + auVar100._8_4_;
  auVar104._12_4_ = auVar111._12_4_ + auVar100._12_4_;
  auVar104._16_4_ = auVar111._16_4_ + auVar100._16_4_;
  auVar104._20_4_ = auVar111._20_4_ + auVar100._20_4_;
  auVar104._24_4_ = auVar111._24_4_ + auVar100._24_4_;
  auVar104._28_4_ = auVar111._28_4_ + auVar100._28_4_;
  auVar106._0_4_ = auVar101._0_4_ + auVar112._0_4_;
  auVar106._4_4_ = auVar101._4_4_ + auVar112._4_4_;
  auVar106._8_4_ = auVar101._8_4_ + auVar112._8_4_;
  auVar106._12_4_ = auVar101._12_4_ + auVar112._12_4_;
  auVar106._16_4_ = auVar101._16_4_ + auVar112._16_4_;
  auVar106._20_4_ = auVar101._20_4_ + auVar112._20_4_;
  auVar106._24_4_ = auVar101._24_4_ + auVar112._24_4_;
  auVar106._28_4_ = auVar101._28_4_ + auVar112._28_4_;
  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar96 = vmulps_avx512vl(auVar98,auVar95);
  auVar97 = vmulps_avx512vl(auVar104,auVar95);
  auVar98 = vmulps_avx512vl(auVar106,auVar95);
  auVar95 = vsubps_avx(auVar96,auVar99);
  auVar96 = vsubps_avx(auVar97,auVar102);
  auVar97 = vsubps_avx(auVar98,auVar103);
  auVar97 = vmulps_avx512vl(auVar97,auVar94);
  auVar96 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar96);
  auVar95 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar95);
  auVar127._0_4_ = auVar95._0_4_ * auVar88._0_4_;
  auVar127._4_4_ = auVar95._4_4_ * auVar88._4_4_;
  auVar127._8_4_ = auVar95._8_4_ * auVar88._8_4_;
  auVar127._12_4_ = auVar95._12_4_ * auVar88._12_4_;
  auVar127._16_4_ = auVar95._16_4_ * 0.0;
  auVar127._20_4_ = auVar95._20_4_ * 0.0;
  auVar127._24_4_ = auVar95._24_4_ * 0.0;
  auVar127._28_4_ = 0;
  auVar95 = vmulps_avx512vl(auVar92,auVar127);
  auVar96 = vmulps_avx512vl(auVar93,auVar127);
  auVar97 = vmulps_avx512vl(auVar94,auVar127);
  auVar149._0_4_ = auVar95._0_4_ + fVar1;
  auVar149._4_4_ = auVar95._4_4_ + fVar1;
  auVar149._8_4_ = auVar95._8_4_ + fVar1;
  auVar149._12_4_ = auVar95._12_4_ + fVar1;
  auVar149._16_4_ = auVar95._16_4_ + fVar1;
  auVar149._20_4_ = auVar95._20_4_ + fVar1;
  auVar149._24_4_ = auVar95._24_4_ + fVar1;
  auVar149._28_4_ = auVar95._28_4_ + fVar1;
  auVar153._0_4_ = fVar2 + auVar96._0_4_;
  auVar153._4_4_ = fVar2 + auVar96._4_4_;
  auVar153._8_4_ = fVar2 + auVar96._8_4_;
  auVar153._12_4_ = fVar2 + auVar96._12_4_;
  auVar153._16_4_ = fVar2 + auVar96._16_4_;
  auVar153._20_4_ = fVar2 + auVar96._20_4_;
  auVar153._24_4_ = fVar2 + auVar96._24_4_;
  auVar153._28_4_ = fVar2 + auVar96._28_4_;
  auVar95 = vaddps_avx512vl(auVar103,auVar97);
  auVar97 = vsubps_avx512vl(auVar116,auVar105);
  auVar174 = ZEXT3264(auVar97);
  auVar98 = vsubps_avx512vl(auVar111,auVar100);
  auVar172 = ZEXT3264(auVar98);
  auVar99 = vsubps_avx512vl(auVar112,auVar101);
  auVar173 = ZEXT3264(auVar99);
  _local_520 = vsubps_avx(auVar149,auVar105);
  _local_540 = vsubps_avx(auVar153,auVar100);
  auVar100 = vsubps_avx512vl(auVar95,auVar101);
  auVar175 = ZEXT3264(auVar100);
  auVar96 = vmulps_avx512vl(auVar99,auVar99);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar98);
  auVar101 = vfmadd231ps_avx512vl(auVar96,auVar97,auVar97);
  auVar96 = vmulps_avx512vl(auVar99,auVar100);
  auVar96 = vfmadd231ps_avx512vl(auVar96,_local_540,auVar98);
  auVar102 = vfmadd231ps_avx512vl(auVar96,_local_520,auVar97);
  auVar96 = vmulps_avx512vl(auVar99,auVar94);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar98);
  auVar103 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar97);
  auVar104 = vsubps_avx512vl(auVar123,auVar91);
  fVar1 = auVar104._0_4_;
  fVar55 = auVar104._4_4_;
  fVar57 = auVar104._8_4_;
  fVar59 = auVar104._12_4_;
  fVar61 = auVar104._16_4_;
  fVar63 = auVar104._20_4_;
  fVar65 = auVar104._24_4_;
  auVar130._0_4_ = fVar1 * fVar1 + auVar101._0_4_;
  auVar130._4_4_ = fVar55 * fVar55 + auVar101._4_4_;
  auVar130._8_4_ = fVar57 * fVar57 + auVar101._8_4_;
  auVar130._12_4_ = fVar59 * fVar59 + auVar101._12_4_;
  auVar130._16_4_ = fVar61 * fVar61 + auVar101._16_4_;
  auVar130._20_4_ = fVar63 * fVar63 + auVar101._20_4_;
  auVar130._24_4_ = fVar65 * fVar65 + auVar101._24_4_;
  auVar130._28_4_ = auVar105._28_4_ + auVar101._28_4_;
  auVar96 = vmulps_avx512vl(auVar94,auVar100);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,_local_540);
  auVar105 = vfmadd231ps_avx512vl(auVar96,auVar92,_local_520);
  auVar96 = vmulps_avx512vl(auVar100,auVar100);
  auVar96 = vfmadd231ps_avx512vl(auVar96,_local_540,_local_540);
  auVar106 = vfmadd231ps_avx512vl(auVar96,_local_520,_local_520);
  auVar107 = vmulps_avx512vl(auVar101,auVar101);
  auVar176 = ZEXT3264(auVar107);
  auVar108 = vmulps_avx512vl(auVar123,auVar101);
  fVar2 = auVar103._0_4_;
  fVar56 = auVar103._4_4_;
  auVar96._4_4_ = fVar56 * fVar56;
  auVar96._0_4_ = fVar2 * fVar2;
  fVar58 = auVar103._8_4_;
  auVar96._8_4_ = fVar58 * fVar58;
  fVar60 = auVar103._12_4_;
  auVar96._12_4_ = fVar60 * fVar60;
  fVar62 = auVar103._16_4_;
  auVar96._16_4_ = fVar62 * fVar62;
  fVar64 = auVar103._20_4_;
  auVar96._20_4_ = fVar64 * fVar64;
  fVar66 = auVar103._24_4_;
  auVar96._24_4_ = fVar66 * fVar66;
  auVar96._28_4_ = local_520._28_4_;
  auVar109 = vmulps_avx512vl(auVar130,auVar96);
  auVar109 = vsubps_avx512vl(auVar107,auVar109);
  auVar105 = vmulps_avx512vl(auVar107,auVar105);
  auVar110 = vmulps_avx512vl(auVar103,auVar102);
  auVar110 = vmulps_avx512vl(auVar130,auVar110);
  auVar105 = vsubps_avx512vl(auVar105,auVar110);
  auVar110 = vmulps_avx512vl(auVar104,auVar103);
  auVar110 = vmulps_avx512vl(auVar108,auVar110);
  auVar105 = vaddps_avx512vl(auVar110,auVar105);
  auVar106 = vmulps_avx512vl(auVar107,auVar106);
  auVar110 = vmulps_avx512vl(auVar102,auVar102);
  auVar110 = vmulps_avx512vl(auVar130,auVar110);
  auVar106 = vsubps_avx512vl(auVar106,auVar110);
  auVar104 = vaddps_avx512vl(auVar104,auVar104);
  auVar104 = vmulps_avx512vl(auVar104,auVar102);
  auVar104 = vsubps_avx512vl(auVar104,auVar108);
  auVar104 = vmulps_avx512vl(auVar108,auVar104);
  auVar104 = vaddps_avx512vl(auVar106,auVar104);
  auVar106 = vmulps_avx512vl(auVar105,auVar105);
  auVar104 = vmulps_avx512vl(auVar109,auVar104);
  auVar104 = vsubps_avx512vl(auVar106,auVar104);
  uVar79 = vcmpps_avx512vl(auVar104,ZEXT1632(auVar89),5);
  bVar84 = (byte)(uVar71 & uVar79);
  if (bVar84 != 0) {
    auVar116 = vsubps_avx(auVar149,auVar116);
    auVar111 = vsubps_avx512vl(auVar153,auVar111);
    auVar112 = vsubps_avx512vl(auVar95,auVar112);
    auVar104 = vsqrtps_avx512vl(auVar104);
    auVar95 = vrcp14ps_avx512vl(auVar109);
    auVar134._8_4_ = 0x3f800000;
    auVar134._0_8_ = &DAT_3f8000003f800000;
    auVar134._12_4_ = 0x3f800000;
    auVar134._16_4_ = 0x3f800000;
    auVar134._20_4_ = 0x3f800000;
    auVar134._24_4_ = 0x3f800000;
    auVar134._28_4_ = 0x3f800000;
    auVar106 = vfnmadd213ps_avx512vl(auVar95,auVar109,auVar134);
    auVar88 = vfmadd132ps_fma(auVar106,auVar95,auVar95);
    auVar108._8_4_ = 0x7fffffff;
    auVar108._0_8_ = 0x7fffffff7fffffff;
    auVar108._12_4_ = 0x7fffffff;
    auVar108._16_4_ = 0x7fffffff;
    auVar108._20_4_ = 0x7fffffff;
    auVar108._24_4_ = 0x7fffffff;
    auVar108._28_4_ = 0x7fffffff;
    vandps_avx512vl(auVar109,auVar108);
    auVar109._8_4_ = 0x219392ef;
    auVar109._0_8_ = 0x219392ef219392ef;
    auVar109._12_4_ = 0x219392ef;
    auVar109._16_4_ = 0x219392ef;
    auVar109._20_4_ = 0x219392ef;
    auVar109._24_4_ = 0x219392ef;
    auVar109._28_4_ = 0x219392ef;
    uVar86 = vcmpps_avx512vl(auVar106,auVar109,2);
    auVar133._8_4_ = 0x80000000;
    auVar133._0_8_ = 0x8000000080000000;
    auVar133._12_4_ = 0x80000000;
    auVar133._16_4_ = 0x80000000;
    auVar133._20_4_ = 0x80000000;
    auVar133._24_4_ = 0x80000000;
    auVar133._28_4_ = 0x80000000;
    auVar95 = vxorps_avx512vl(auVar105,auVar133);
    auVar95 = vsubps_avx(auVar95,auVar104);
    auVar95 = vmulps_avx512vl(auVar95,ZEXT1632(auVar88));
    auVar144._8_4_ = 0xff800000;
    auVar144._0_8_ = 0xff800000ff800000;
    auVar144._12_4_ = 0xff800000;
    auVar144._16_4_ = 0xff800000;
    auVar144._20_4_ = 0xff800000;
    auVar144._24_4_ = 0xff800000;
    auVar144._28_4_ = 0xff800000;
    bVar81 = (bool)((byte)uVar86 & 1);
    auVar113._0_4_ = (uint)bVar81 * -0x800000 | (uint)!bVar81 * auVar95._0_4_;
    bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
    auVar113._4_4_ = (uint)bVar81 * -0x800000 | (uint)!bVar81 * auVar95._4_4_;
    bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
    auVar113._8_4_ = (uint)bVar81 * -0x800000 | (uint)!bVar81 * auVar95._8_4_;
    bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
    auVar113._12_4_ = (uint)bVar81 * -0x800000 | (uint)!bVar81 * auVar95._12_4_;
    bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
    auVar113._16_4_ = (uint)bVar81 * -0x800000 | (uint)!bVar81 * auVar95._16_4_;
    bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
    auVar113._20_4_ = (uint)bVar81 * -0x800000 | (uint)!bVar81 * auVar95._20_4_;
    bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
    auVar113._24_4_ = (uint)bVar81 * -0x800000 | (uint)!bVar81 * auVar95._24_4_;
    bVar81 = SUB81(uVar86 >> 7,0);
    auVar113._28_4_ = (uint)bVar81 * -0x800000 | (uint)!bVar81 * auVar95._28_4_;
    auVar95 = vsubps_avx512vl(auVar104,auVar105);
    auVar146._8_4_ = 0x7f800000;
    auVar146._0_8_ = 0x7f8000007f800000;
    auVar146._12_4_ = 0x7f800000;
    auVar146._16_4_ = 0x7f800000;
    auVar146._20_4_ = 0x7f800000;
    auVar146._24_4_ = 0x7f800000;
    auVar146._28_4_ = 0x7f800000;
    bVar81 = (bool)((byte)uVar86 & 1);
    auVar114._0_4_ =
         (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)(auVar95._0_4_ * auVar88._0_4_);
    bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
    auVar114._4_4_ =
         (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)(auVar95._4_4_ * auVar88._4_4_);
    bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
    auVar114._8_4_ =
         (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)(auVar95._8_4_ * auVar88._8_4_);
    bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
    auVar114._12_4_ =
         (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)(auVar95._12_4_ * auVar88._12_4_);
    bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
    auVar114._16_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)(auVar95._16_4_ * 0.0);
    bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
    auVar114._20_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)(auVar95._20_4_ * 0.0);
    bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
    auVar114._24_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)(auVar95._24_4_ * 0.0);
    bVar81 = SUB81(uVar86 >> 7,0);
    auVar114._28_4_ = (uint)bVar81 * 0x7f800000 | (uint)!bVar81 * (int)auVar153._28_4_;
    auVar150._0_4_ = fVar2 * (float)local_520._0_4_;
    auVar150._4_4_ = fVar56 * (float)local_520._4_4_;
    auVar150._8_4_ = fVar58 * fStack_518;
    auVar150._12_4_ = fVar60 * fStack_514;
    auVar150._16_4_ = fVar62 * fStack_510;
    auVar150._20_4_ = fVar64 * fStack_50c;
    auVar150._24_4_ = fVar66 * fStack_508;
    auVar150._28_4_ = 0;
    auVar95 = vmulps_avx512vl(auVar103,_local_540);
    auVar105 = vmulps_avx512vl(auVar103,auVar100);
    auVar88 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
    auVar104 = vmulps_avx512vl(auVar92,auVar102);
    auVar104 = vsubps_avx512vl(auVar150,auVar104);
    auVar106 = vmulps_avx512vl(auVar93,auVar102);
    auVar95 = vsubps_avx512vl(auVar95,auVar106);
    auVar106 = vmulps_avx512vl(auVar94,auVar102);
    auVar105 = vsubps_avx512vl(auVar105,auVar106);
    auVar106 = vmulps_avx512vl(auVar103,auVar113);
    auVar151._0_4_ = auVar102._0_4_ + auVar106._0_4_;
    auVar151._4_4_ = auVar102._4_4_ + auVar106._4_4_;
    auVar151._8_4_ = auVar102._8_4_ + auVar106._8_4_;
    auVar151._12_4_ = auVar102._12_4_ + auVar106._12_4_;
    auVar151._16_4_ = auVar102._16_4_ + auVar106._16_4_;
    auVar151._20_4_ = auVar102._20_4_ + auVar106._20_4_;
    auVar151._24_4_ = auVar102._24_4_ + auVar106._24_4_;
    auVar151._28_4_ = auVar102._28_4_ + auVar106._28_4_;
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar95 = vfmadd231ps_avx512vl(auVar105,auVar95,auVar95);
    auVar105 = vmulps_avx512vl(auVar103,auVar114);
    auVar105 = vaddps_avx512vl(auVar102,auVar105);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar104,auVar104);
    auVar104 = vmulps_avx512vl(auVar123,auVar123);
    auVar96 = vmulps_avx512vl(auVar104,auVar96);
    uVar86 = vcmpps_avx512vl(auVar95,auVar96,1);
    uVar86 = (bVar84 & ~(byte)line->leftExists) & uVar86;
    auVar95 = vrcp14ps_avx512vl(auVar103);
    auVar96 = vfnmadd213ps_avx512vl(auVar95,auVar103,auVar134);
    auVar95 = vfmadd132ps_avx512vl(auVar96,auVar95,auVar95);
    auVar159 = ZEXT3264(auVar105);
    auVar139._0_8_ = auVar102._0_8_ ^ 0x8000000080000000;
    auVar139._8_4_ = -auVar102._8_4_;
    auVar139._12_4_ = -auVar102._12_4_;
    auVar139._16_4_ = -auVar102._16_4_;
    auVar139._20_4_ = -auVar102._20_4_;
    auVar139._24_4_ = -auVar102._24_4_;
    auVar139._28_4_ = -auVar102._28_4_;
    auVar96 = vmulps_avx512vl(auVar95,auVar139);
    bVar81 = (bool)((byte)uVar86 & 1);
    auVar115._0_4_ = (uint)bVar81 * auVar96._0_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
    auVar115._4_4_ = (uint)bVar81 * auVar96._4_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
    auVar115._8_4_ = (uint)bVar81 * auVar96._8_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
    auVar115._12_4_ = (uint)bVar81 * auVar96._12_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
    auVar115._16_4_ = (uint)bVar81 * auVar96._16_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
    auVar115._20_4_ = (uint)bVar81 * auVar96._20_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
    auVar115._24_4_ = (uint)bVar81 * auVar96._24_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = SUB81(uVar86 >> 7,0);
    auVar115._28_4_ = (uint)bVar81 * auVar96._28_4_ | (uint)!bVar81 * 0x7f800000;
    uVar67 = vcmpps_avx512vl(auVar151,auVar101,1);
    uVar68 = vcmpps_avx512vl(auVar151,ZEXT1632(auVar88),6);
    uVar69 = vcmpps_avx512vl(auVar105,auVar101,1);
    uVar70 = vcmpps_avx512vl(auVar105,ZEXT1632(auVar88),6);
    auVar96 = vmulps_avx512vl(auVar99,auVar112);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar111,auVar98);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar116,auVar97);
    auVar110._4_4_ = fVar56 * auVar116._4_4_;
    auVar110._0_4_ = fVar2 * auVar116._0_4_;
    auVar110._8_4_ = fVar58 * auVar116._8_4_;
    auVar110._12_4_ = fVar60 * auVar116._12_4_;
    auVar110._16_4_ = fVar62 * auVar116._16_4_;
    auVar110._20_4_ = fVar64 * auVar116._20_4_;
    auVar110._24_4_ = fVar66 * auVar116._24_4_;
    auVar110._28_4_ = auVar139._28_4_;
    auVar111 = vmulps_avx512vl(auVar103,auVar111);
    auVar116 = vmulps_avx512vl(auVar103,auVar112);
    auVar102 = vmulps_avx512vl(auVar92,auVar96);
    auVar102 = vsubps_avx512vl(auVar110,auVar102);
    auVar103 = vmulps_avx512vl(auVar93,auVar96);
    auVar111 = vsubps_avx512vl(auVar111,auVar103);
    auVar103 = vmulps_avx512vl(auVar94,auVar96);
    auVar116 = vsubps_avx512vl(auVar116,auVar103);
    auVar76._4_4_ = auVar116._4_4_ * auVar116._4_4_;
    auVar76._0_4_ = auVar116._0_4_ * auVar116._0_4_;
    auVar76._8_4_ = auVar116._8_4_ * auVar116._8_4_;
    auVar76._12_4_ = auVar116._12_4_ * auVar116._12_4_;
    auVar76._16_4_ = auVar116._16_4_ * auVar116._16_4_;
    auVar76._20_4_ = auVar116._20_4_ * auVar116._20_4_;
    auVar76._24_4_ = auVar116._24_4_ * auVar116._24_4_;
    auVar76._28_4_ = auVar116._28_4_;
    auVar88 = vfmadd231ps_fma(auVar76,auVar111,auVar111);
    auVar155 = ZEXT3264(auVar115);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar102,auVar102);
    auVar111 = vmulps_avx512vl(auVar91,auVar91);
    auVar77._4_4_ = fVar56 * fVar56 * auVar111._4_4_;
    auVar77._0_4_ = fVar2 * fVar2 * auVar111._0_4_;
    auVar77._8_4_ = fVar58 * fVar58 * auVar111._8_4_;
    auVar77._12_4_ = fVar60 * fVar60 * auVar111._12_4_;
    auVar77._16_4_ = fVar62 * fVar62 * auVar111._16_4_;
    auVar77._20_4_ = fVar64 * fVar64 * auVar111._20_4_;
    auVar77._24_4_ = fVar66 * fVar66 * auVar111._24_4_;
    auVar77._28_4_ = auVar111._28_4_;
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar140._4_4_ = uVar3;
    auVar140._0_4_ = uVar3;
    auVar140._8_4_ = uVar3;
    auVar140._12_4_ = uVar3;
    auVar140._16_4_ = uVar3;
    auVar140._20_4_ = uVar3;
    auVar140._24_4_ = uVar3;
    auVar140._28_4_ = uVar3;
    bVar72 = (byte)uVar67 & (byte)uVar68 & bVar84;
    auVar111 = vblendmps_avx512vl(auVar146,auVar113);
    auVar117._0_4_ =
         (uint)(bVar72 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar103._0_4_;
    bVar81 = (bool)(bVar72 >> 1 & 1);
    auVar117._4_4_ = (uint)bVar81 * auVar111._4_4_ | (uint)!bVar81 * auVar103._4_4_;
    bVar81 = (bool)(bVar72 >> 2 & 1);
    auVar117._8_4_ = (uint)bVar81 * auVar111._8_4_ | (uint)!bVar81 * auVar103._8_4_;
    bVar81 = (bool)(bVar72 >> 3 & 1);
    auVar117._12_4_ = (uint)bVar81 * auVar111._12_4_ | (uint)!bVar81 * auVar103._12_4_;
    bVar81 = (bool)(bVar72 >> 4 & 1);
    auVar117._16_4_ = (uint)bVar81 * auVar111._16_4_ | (uint)!bVar81 * auVar103._16_4_;
    bVar81 = (bool)(bVar72 >> 5 & 1);
    auVar117._20_4_ = (uint)bVar81 * auVar111._20_4_ | (uint)!bVar81 * auVar103._20_4_;
    bVar81 = (bool)(bVar72 >> 6 & 1);
    auVar117._24_4_ = (uint)bVar81 * auVar111._24_4_ | (uint)!bVar81 * auVar103._24_4_;
    auVar117._28_4_ =
         (uint)(bVar72 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar72 >> 7) * auVar103._28_4_;
    auVar156 = ZEXT3264(auVar117);
    auVar135._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
    auVar135._8_4_ = auVar96._8_4_ ^ 0x80000000;
    auVar135._12_4_ = auVar96._12_4_ ^ 0x80000000;
    auVar135._16_4_ = auVar96._16_4_ ^ 0x80000000;
    auVar135._20_4_ = auVar96._20_4_ ^ 0x80000000;
    auVar135._24_4_ = auVar96._24_4_ ^ 0x80000000;
    auVar135._28_4_ = auVar96._28_4_ ^ 0x80000000;
    uVar86 = vcmpps_avx512vl(ZEXT1632(auVar88),auVar77,1);
    uVar86 = (bVar84 & ~(byte)line->rightExists) & uVar86;
    auVar95 = vmulps_avx512vl(auVar95,auVar135);
    bVar81 = (bool)((byte)uVar86 & 1);
    auVar118._0_4_ = (uint)bVar81 * auVar95._0_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
    auVar118._4_4_ = (uint)bVar81 * auVar95._4_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
    auVar118._8_4_ = (uint)bVar81 * auVar95._8_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
    auVar118._12_4_ = (uint)bVar81 * auVar95._12_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
    auVar118._16_4_ = (uint)bVar81 * auVar95._16_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
    auVar118._20_4_ = (uint)bVar81 * auVar95._20_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
    auVar118._24_4_ = (uint)bVar81 * auVar95._24_4_ | (uint)!bVar81 * 0x7f800000;
    bVar81 = SUB81(uVar86 >> 7,0);
    auVar118._28_4_ = (uint)bVar81 * auVar95._28_4_ | (uint)!bVar81 * 0x7f800000;
    auVar96 = vminps_avx(auVar115,auVar118);
    auVar95 = vmaxps_avx(auVar115,auVar118);
    auVar111 = vminps_avx512vl(auVar117,auVar96);
    uVar86 = vcmpps_avx512vl(auVar111,auVar96,0);
    uVar85 = vcmpps_avx512vl(auVar95,auVar146,0);
    bVar81 = (bool)((byte)uVar85 & 1);
    bVar18 = (bool)((byte)(uVar85 >> 1) & 1);
    bVar20 = (bool)((byte)(uVar85 >> 2) & 1);
    bVar22 = (bool)((byte)(uVar85 >> 3) & 1);
    bVar24 = (bool)((byte)(uVar85 >> 4) & 1);
    bVar30 = (bool)((byte)(uVar85 >> 5) & 1);
    bVar38 = (bool)((byte)(uVar85 >> 6) & 1);
    bVar48 = SUB81(uVar85 >> 7,0);
    uVar85 = vcmpps_avx512vl(auVar96,auVar146,0);
    bVar82 = (bool)((byte)uVar85 & 1);
    bVar19 = (bool)((byte)(uVar85 >> 1) & 1);
    bVar21 = (bool)((byte)(uVar85 >> 2) & 1);
    bVar23 = (bool)((byte)(uVar85 >> 3) & 1);
    bVar25 = (bool)((byte)(uVar85 >> 4) & 1);
    bVar31 = (bool)((byte)(uVar85 >> 5) & 1);
    bVar39 = (bool)((byte)(uVar85 >> 6) & 1);
    bVar49 = SUB81(uVar85 >> 7,0);
    bVar17 = (bool)((byte)uVar86 & 1);
    auVar119._0_4_ =
         (uint)bVar17 * ((uint)bVar81 * -0x800000 | (uint)!bVar81 * auVar95._0_4_) |
         (uint)!bVar17 * ((uint)bVar82 * -0x800000 | (uint)!bVar82 * auVar96._0_4_);
    bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
    auVar119._4_4_ =
         (uint)bVar81 * ((uint)bVar18 * -0x800000 | (uint)!bVar18 * auVar95._4_4_) |
         (uint)!bVar81 * ((uint)bVar19 * -0x800000 | (uint)!bVar19 * auVar96._4_4_);
    bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
    auVar119._8_4_ =
         (uint)bVar81 * ((uint)bVar20 * -0x800000 | (uint)!bVar20 * auVar95._8_4_) |
         (uint)!bVar81 * ((uint)bVar21 * -0x800000 | (uint)!bVar21 * auVar96._8_4_);
    bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
    auVar119._12_4_ =
         (uint)bVar81 * ((uint)bVar22 * -0x800000 | (uint)!bVar22 * auVar95._12_4_) |
         (uint)!bVar81 * ((uint)bVar23 * -0x800000 | (uint)!bVar23 * auVar96._12_4_);
    bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
    auVar119._16_4_ =
         (uint)bVar81 * ((uint)bVar24 * -0x800000 | (uint)!bVar24 * auVar95._16_4_) |
         (uint)!bVar81 * ((uint)bVar25 * -0x800000 | (uint)!bVar25 * auVar96._16_4_);
    bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
    auVar119._20_4_ =
         (uint)bVar81 * ((uint)bVar30 * -0x800000 | (uint)!bVar30 * auVar95._20_4_) |
         (uint)!bVar81 * ((uint)bVar31 * -0x800000 | (uint)!bVar31 * auVar96._20_4_);
    bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
    auVar119._24_4_ =
         (uint)bVar81 * ((uint)bVar38 * -0x800000 | (uint)!bVar38 * auVar95._24_4_) |
         (uint)!bVar81 * ((uint)bVar39 * -0x800000 | (uint)!bVar39 * auVar96._24_4_);
    bVar81 = SUB81(uVar86 >> 7,0);
    auVar119._28_4_ =
         (uint)bVar81 * ((uint)bVar48 * -0x800000 | (uint)!bVar48 * auVar95._28_4_) |
         (uint)!bVar81 * ((uint)bVar49 * -0x800000 | (uint)!bVar49 * auVar96._28_4_);
    auVar137._0_4_ = auVar127._0_4_ + auVar111._0_4_;
    auVar137._4_4_ = auVar127._4_4_ + auVar111._4_4_;
    auVar137._8_4_ = auVar127._8_4_ + auVar111._8_4_;
    auVar137._12_4_ = auVar127._12_4_ + auVar111._12_4_;
    auVar137._16_4_ = auVar127._16_4_ + auVar111._16_4_;
    auVar137._20_4_ = auVar127._20_4_ + auVar111._20_4_;
    auVar137._24_4_ = auVar127._24_4_ + auVar111._24_4_;
    auVar137._28_4_ = auVar111._28_4_ + 0.0;
    uVar86 = vcmpps_avx512vl(auVar140,auVar137,2);
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar142._4_4_ = uVar3;
    auVar142._0_4_ = uVar3;
    auVar142._8_4_ = uVar3;
    auVar142._12_4_ = uVar3;
    auVar142._16_4_ = uVar3;
    auVar142._20_4_ = uVar3;
    auVar142._24_4_ = uVar3;
    auVar142._28_4_ = uVar3;
    uVar85 = vcmpps_avx512vl(auVar137,auVar142,2);
    bVar72 = (byte)uVar69 & (byte)uVar70 & bVar84;
    auVar95 = vblendmps_avx512vl(auVar144,auVar114);
    auVar120._0_4_ = (uint)(bVar72 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar112._0_4_
    ;
    bVar81 = (bool)(bVar72 >> 1 & 1);
    auVar120._4_4_ = (uint)bVar81 * auVar95._4_4_ | (uint)!bVar81 * auVar112._4_4_;
    bVar81 = (bool)(bVar72 >> 2 & 1);
    auVar120._8_4_ = (uint)bVar81 * auVar95._8_4_ | (uint)!bVar81 * auVar112._8_4_;
    bVar81 = (bool)(bVar72 >> 3 & 1);
    auVar120._12_4_ = (uint)bVar81 * auVar95._12_4_ | (uint)!bVar81 * auVar112._12_4_;
    bVar81 = (bool)(bVar72 >> 4 & 1);
    auVar120._16_4_ = (uint)bVar81 * auVar95._16_4_ | (uint)!bVar81 * auVar112._16_4_;
    bVar81 = (bool)(bVar72 >> 5 & 1);
    auVar120._20_4_ = (uint)bVar81 * auVar95._20_4_ | (uint)!bVar81 * auVar112._20_4_;
    bVar81 = (bool)(bVar72 >> 6 & 1);
    auVar120._24_4_ = (uint)bVar81 * auVar95._24_4_ | (uint)!bVar81 * auVar112._24_4_;
    auVar120._28_4_ =
         (uint)(bVar72 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar72 >> 7) * auVar112._28_4_;
    auVar157 = ZEXT3264(auVar120);
    auVar95 = vmaxps_avx512vl(auVar120,auVar119);
    auVar154 = ZEXT3264(auVar95);
    uVar87 = vcmpps_avx512vl(auVar111,auVar146,4);
    uVar87 = uVar86 & uVar85 & uVar87;
    auVar147._0_4_ = auVar95._0_4_ + auVar127._0_4_;
    auVar147._4_4_ = auVar95._4_4_ + auVar127._4_4_;
    auVar147._8_4_ = auVar95._8_4_ + auVar127._8_4_;
    auVar147._12_4_ = auVar95._12_4_ + auVar127._12_4_;
    auVar147._16_4_ = auVar95._16_4_ + auVar127._16_4_;
    auVar147._20_4_ = auVar95._20_4_ + auVar127._20_4_;
    auVar147._24_4_ = auVar95._24_4_ + auVar127._24_4_;
    auVar147._28_4_ = auVar95._28_4_ + 0.0;
    auVar148 = ZEXT3264(auVar147);
    uVar67 = vcmpps_avx512vl(auVar140,auVar147,2);
    uVar68 = vcmpps_avx512vl(auVar147,auVar142,2);
    uVar69 = vcmpps_avx512vl(auVar95,auVar144,4);
    bVar83 = (byte)uVar67 & (byte)uVar68 & (byte)uVar69;
    bVar72 = (byte)uVar87 & bVar84;
    bVar73 = bVar83 & bVar84;
    if (bVar72 != 0 || bVar73 != 0) {
      auVar95 = vblendmps_avx512vl(auVar95,auVar111);
      auVar121._0_4_ =
           (float)((uint)(bVar72 & 1) * auVar95._0_4_ |
                  (uint)!(bool)(bVar72 & 1) * (int)auVar111._0_4_);
      bVar81 = (bool)(bVar72 >> 1 & 1);
      auVar121._4_4_ = (float)((uint)bVar81 * auVar95._4_4_ | (uint)!bVar81 * (int)auVar111._4_4_);
      bVar81 = (bool)(bVar72 >> 2 & 1);
      auVar121._8_4_ = (float)((uint)bVar81 * auVar95._8_4_ | (uint)!bVar81 * (int)auVar111._8_4_);
      bVar81 = (bool)(bVar72 >> 3 & 1);
      auVar121._12_4_ =
           (float)((uint)bVar81 * auVar95._12_4_ | (uint)!bVar81 * (int)auVar111._12_4_);
      bVar81 = (bool)(bVar72 >> 4 & 1);
      auVar121._16_4_ =
           (float)((uint)bVar81 * auVar95._16_4_ | (uint)!bVar81 * (int)auVar111._16_4_);
      bVar81 = (bool)(bVar72 >> 5 & 1);
      auVar121._20_4_ =
           (float)((uint)bVar81 * auVar95._20_4_ | (uint)!bVar81 * (int)auVar111._20_4_);
      bVar81 = (bool)(bVar72 >> 6 & 1);
      auVar121._24_4_ =
           (float)((uint)bVar81 * auVar95._24_4_ | (uint)!bVar81 * (int)auVar111._24_4_);
      auVar121._28_4_ =
           (float)((uint)(bVar72 >> 7) * auVar95._28_4_ |
                  (uint)!(bool)(bVar72 >> 7) * (int)auVar111._28_4_);
      uVar67 = vcmpps_avx512vl(auVar121,auVar117,0);
      uVar68 = vcmpps_avx512vl(auVar121,auVar120,0);
      auVar95 = vblendmps_avx512vl(auVar105,auVar151);
      auVar122._0_4_ =
           (float)((uint)(bVar72 & 1) * auVar95._0_4_ | !(bool)(bVar72 & 1) * auVar119._0_4_);
      bVar81 = (bool)(bVar72 >> 1 & 1);
      auVar122._4_4_ = (float)((uint)bVar81 * auVar95._4_4_ | !bVar81 * auVar119._4_4_);
      bVar81 = (bool)(bVar72 >> 2 & 1);
      auVar122._8_4_ = (float)((uint)bVar81 * auVar95._8_4_ | !bVar81 * auVar119._8_4_);
      bVar81 = (bool)(bVar72 >> 3 & 1);
      auVar122._12_4_ = (float)((uint)bVar81 * auVar95._12_4_ | !bVar81 * auVar119._12_4_);
      bVar81 = (bool)(bVar72 >> 4 & 1);
      auVar122._16_4_ = (float)((uint)bVar81 * auVar95._16_4_ | !bVar81 * auVar119._16_4_);
      bVar81 = (bool)(bVar72 >> 5 & 1);
      auVar122._20_4_ = (float)((uint)bVar81 * auVar95._20_4_ | !bVar81 * auVar119._20_4_);
      bVar81 = (bool)(bVar72 >> 6 & 1);
      auVar122._24_4_ = (float)((uint)bVar81 * auVar95._24_4_ | !bVar81 * auVar119._24_4_);
      auVar122._28_4_ =
           (uint)(bVar72 >> 7) * auVar95._28_4_ | !(bool)(bVar72 >> 7) * auVar119._28_4_;
      auVar78._4_4_ = auVar123._4_4_ * fVar55 * auVar101._4_4_;
      auVar78._0_4_ = auVar123._0_4_ * fVar1 * auVar101._0_4_;
      auVar78._8_4_ = auVar123._8_4_ * fVar57 * auVar101._8_4_;
      auVar78._12_4_ = auVar123._12_4_ * fVar59 * auVar101._12_4_;
      auVar78._16_4_ = auVar123._16_4_ * fVar61 * auVar101._16_4_;
      auVar78._20_4_ = auVar123._20_4_ * fVar63 * auVar101._20_4_;
      auVar78._24_4_ = auVar123._24_4_ * fVar65 * auVar101._24_4_;
      auVar78._28_4_ = auVar123._28_4_;
      auVar95 = vmulps_avx512vl(auVar97,auVar78);
      auVar145 = ZEXT3264(auVar95);
      auVar96 = vmulps_avx512vl(auVar98,auVar78);
      auVar152 = ZEXT3264(auVar96);
      auVar123 = vmulps_avx512vl(auVar99,auVar78);
      auVar158 = ZEXT3264(auVar123);
      local_80 = vmulps_avx512vl(auVar97,auVar130);
      local_a0 = vmulps_avx512vl(auVar98,auVar130);
      auVar105 = vmulps_avx512vl(auVar99,auVar130);
      bVar74 = ((byte)uVar67 | (byte)uVar68) & bVar84;
      uVar86 = vcmpps_avx512vl(auVar121,auVar115,0);
      uVar86 = uVar71 & uVar79 & uVar86;
      auVar111 = vmulps_avx512vl(auVar92,auVar121);
      auVar116 = vmulps_avx512vl(auVar93,auVar121);
      auVar112 = vmulps_avx512vl(auVar94,auVar121);
      auVar124._0_4_ = auVar111._0_4_ + (float)local_520._0_4_;
      auVar124._4_4_ = auVar111._4_4_ + (float)local_520._4_4_;
      auVar124._8_4_ = auVar111._8_4_ + fStack_518;
      auVar124._12_4_ = auVar111._12_4_ + fStack_514;
      auVar124._16_4_ = auVar111._16_4_ + fStack_510;
      auVar124._20_4_ = auVar111._20_4_ + fStack_50c;
      auVar124._24_4_ = auVar111._24_4_ + fStack_508;
      auVar124._28_4_ = auVar111._28_4_ + local_520._28_4_;
      auVar131._0_4_ = auVar116._0_4_ + (float)local_540._0_4_;
      auVar131._4_4_ = auVar116._4_4_ + (float)local_540._4_4_;
      auVar131._8_4_ = auVar116._8_4_ + fStack_538;
      auVar131._12_4_ = auVar116._12_4_ + fStack_534;
      auVar131._16_4_ = auVar116._16_4_ + fStack_530;
      auVar131._20_4_ = auVar116._20_4_ + fStack_52c;
      auVar131._24_4_ = auVar116._24_4_ + fStack_528;
      auVar131._28_4_ = auVar116._28_4_ + fStack_524;
      auVar100 = vaddps_avx512vl(auVar100,auVar112);
      auVar111 = vmulps_avx512vl(auVar107,auVar124);
      auVar116 = vmulps_avx512vl(auVar107,auVar131);
      auVar100 = vmulps_avx512vl(auVar107,auVar100);
      auVar107._0_4_ = auVar95._0_4_ + auVar111._0_4_;
      auVar107._4_4_ = auVar95._4_4_ + auVar111._4_4_;
      auVar107._8_4_ = auVar95._8_4_ + auVar111._8_4_;
      auVar107._12_4_ = auVar95._12_4_ + auVar111._12_4_;
      auVar107._16_4_ = auVar95._16_4_ + auVar111._16_4_;
      auVar107._20_4_ = auVar95._20_4_ + auVar111._20_4_;
      auVar107._24_4_ = auVar95._24_4_ + auVar111._24_4_;
      auVar107._28_4_ = auVar95._28_4_ + auVar111._28_4_;
      auVar132._0_4_ = auVar96._0_4_ + auVar116._0_4_;
      auVar132._4_4_ = auVar96._4_4_ + auVar116._4_4_;
      auVar132._8_4_ = auVar96._8_4_ + auVar116._8_4_;
      auVar132._12_4_ = auVar96._12_4_ + auVar116._12_4_;
      auVar132._16_4_ = auVar96._16_4_ + auVar116._16_4_;
      auVar132._20_4_ = auVar96._20_4_ + auVar116._20_4_;
      auVar132._24_4_ = auVar96._24_4_ + auVar116._24_4_;
      auVar132._28_4_ = auVar96._28_4_ + auVar116._28_4_;
      auVar95 = vaddps_avx512vl(auVar123,auVar100);
      auVar92._4_4_ = local_80._4_4_ * auVar122._4_4_;
      auVar92._0_4_ = local_80._0_4_ * auVar122._0_4_;
      auVar92._8_4_ = local_80._8_4_ * auVar122._8_4_;
      auVar92._12_4_ = local_80._12_4_ * auVar122._12_4_;
      auVar92._16_4_ = local_80._16_4_ * auVar122._16_4_;
      auVar92._20_4_ = local_80._20_4_ * auVar122._20_4_;
      auVar92._24_4_ = local_80._24_4_ * auVar122._24_4_;
      auVar92._28_4_ = local_80._28_4_;
      auVar93._4_4_ = local_a0._4_4_ * auVar122._4_4_;
      auVar93._0_4_ = local_a0._0_4_ * auVar122._0_4_;
      auVar93._8_4_ = local_a0._8_4_ * auVar122._8_4_;
      auVar93._12_4_ = local_a0._12_4_ * auVar122._12_4_;
      auVar93._16_4_ = local_a0._16_4_ * auVar122._16_4_;
      auVar93._20_4_ = local_a0._20_4_ * auVar122._20_4_;
      auVar93._24_4_ = local_a0._24_4_ * auVar122._24_4_;
      auVar93._28_4_ = local_a0._28_4_;
      local_c0 = vxorps_avx512vl(auVar97,auVar133);
      auVar96 = vblendmps_avx512vl(auVar97,local_c0);
      bVar72 = (byte)uVar86;
      bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar86 >> 2) & 1);
      bVar18 = (bool)((byte)(uVar86 >> 3) & 1);
      bVar19 = (bool)((byte)(uVar86 >> 4) & 1);
      bVar20 = (bool)((byte)(uVar86 >> 5) & 1);
      bVar21 = (bool)((byte)(uVar86 >> 6) & 1);
      bVar22 = SUB81(uVar86 >> 7,0);
      auVar97 = vsubps_avx512vl(auVar107,auVar92);
      local_400._0_4_ =
           (uint)(bVar74 & 1) * auVar97._0_4_ |
           (uint)!(bool)(bVar74 & 1) *
           ((uint)(bVar72 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar72 & 1) * local_c0._0_4_);
      bVar82 = (bool)(bVar74 >> 1 & 1);
      local_400._4_4_ =
           (uint)bVar82 * auVar97._4_4_ |
           (uint)!bVar82 * ((uint)bVar81 * auVar96._4_4_ | (uint)!bVar81 * local_c0._4_4_);
      bVar81 = (bool)(bVar74 >> 2 & 1);
      local_400._8_4_ =
           (uint)bVar81 * auVar97._8_4_ |
           (uint)!bVar81 * ((uint)bVar17 * auVar96._8_4_ | (uint)!bVar17 * local_c0._8_4_);
      bVar81 = (bool)(bVar74 >> 3 & 1);
      local_400._12_4_ =
           (uint)bVar81 * auVar97._12_4_ |
           (uint)!bVar81 * ((uint)bVar18 * auVar96._12_4_ | (uint)!bVar18 * local_c0._12_4_);
      bVar81 = (bool)(bVar74 >> 4 & 1);
      local_400._16_4_ =
           (uint)bVar81 * auVar97._16_4_ |
           (uint)!bVar81 * ((uint)bVar19 * auVar96._16_4_ | (uint)!bVar19 * local_c0._16_4_);
      bVar81 = (bool)(bVar74 >> 5 & 1);
      local_400._20_4_ =
           (uint)bVar81 * auVar97._20_4_ |
           (uint)!bVar81 * ((uint)bVar20 * auVar96._20_4_ | (uint)!bVar20 * local_c0._20_4_);
      bVar81 = (bool)(bVar74 >> 6 & 1);
      local_400._24_4_ =
           (uint)bVar81 * auVar97._24_4_ |
           (uint)!bVar81 * ((uint)bVar21 * auVar96._24_4_ | (uint)!bVar21 * local_c0._24_4_);
      local_400._28_4_ =
           (uint)(bVar74 >> 7) * auVar97._28_4_ |
           (uint)!(bool)(bVar74 >> 7) *
           ((uint)bVar22 * auVar96._28_4_ | (uint)!bVar22 * local_c0._28_4_);
      auVar138 = ZEXT3264(auVar105);
      auVar96 = vxorps_avx512vl(auVar98,auVar133);
      auVar160 = ZEXT3264(auVar96);
      auVar96 = vblendmps_avx512vl(auVar98,auVar96);
      bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
      bVar19 = (bool)((byte)(uVar86 >> 2) & 1);
      bVar22 = (bool)((byte)(uVar86 >> 3) & 1);
      bVar25 = (bool)((byte)(uVar86 >> 4) & 1);
      bVar38 = (bool)((byte)(uVar86 >> 5) & 1);
      bVar49 = (bool)((byte)(uVar86 >> 6) & 1);
      bVar50 = SUB81(uVar86 >> 7,0);
      auVar97 = vsubps_avx512vl(auVar132,auVar93);
      bVar82 = (bool)(bVar74 >> 1 & 1);
      bVar20 = (bool)(bVar74 >> 2 & 1);
      bVar23 = (bool)(bVar74 >> 3 & 1);
      bVar30 = (bool)(bVar74 >> 4 & 1);
      bVar39 = (bool)(bVar74 >> 5 & 1);
      bVar40 = (bool)(bVar74 >> 6 & 1);
      auVar94._4_4_ = auVar105._4_4_ * auVar122._4_4_;
      auVar94._0_4_ = auVar105._0_4_ * auVar122._0_4_;
      auVar94._8_4_ = auVar105._8_4_ * auVar122._8_4_;
      auVar94._12_4_ = auVar105._12_4_ * auVar122._12_4_;
      auVar94._16_4_ = auVar105._16_4_ * auVar122._16_4_;
      auVar94._20_4_ = auVar105._20_4_ * auVar122._20_4_;
      auVar94._24_4_ = auVar105._24_4_ * auVar122._24_4_;
      auVar94._28_4_ = auVar132._28_4_;
      local_e0 = vxorps_avx512vl(auVar99,auVar133);
      auVar100 = vblendmps_avx512vl(auVar99,local_e0);
      bVar17 = (bool)((byte)(uVar86 >> 1) & 1);
      bVar21 = (bool)((byte)(uVar86 >> 2) & 1);
      bVar24 = (bool)((byte)(uVar86 >> 3) & 1);
      bVar31 = (bool)((byte)(uVar86 >> 4) & 1);
      bVar48 = (bool)((byte)(uVar86 >> 5) & 1);
      bVar41 = (bool)((byte)(uVar86 >> 6) & 1);
      bVar51 = SUB81(uVar86 >> 7,0);
      auVar95 = vsubps_avx512vl(auVar95,auVar94);
      local_3c0._0_4_ =
           (uint)(bVar74 & 1) * auVar95._0_4_ |
           (uint)!(bool)(bVar74 & 1) *
           ((uint)(bVar72 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar72 & 1) * local_e0._0_4_);
      bVar18 = (bool)(bVar74 >> 1 & 1);
      local_3c0._4_4_ =
           (uint)bVar18 * auVar95._4_4_ |
           (uint)!bVar18 * ((uint)bVar17 * auVar100._4_4_ | (uint)!bVar17 * local_e0._4_4_);
      bVar17 = (bool)(bVar74 >> 2 & 1);
      local_3c0._8_4_ =
           (uint)bVar17 * auVar95._8_4_ |
           (uint)!bVar17 * ((uint)bVar21 * auVar100._8_4_ | (uint)!bVar21 * local_e0._8_4_);
      bVar17 = (bool)(bVar74 >> 3 & 1);
      local_3c0._12_4_ =
           (uint)bVar17 * auVar95._12_4_ |
           (uint)!bVar17 * ((uint)bVar24 * auVar100._12_4_ | (uint)!bVar24 * local_e0._12_4_);
      bVar17 = (bool)(bVar74 >> 4 & 1);
      local_3c0._16_4_ =
           (uint)bVar17 * auVar95._16_4_ |
           (uint)!bVar17 * ((uint)bVar31 * auVar100._16_4_ | (uint)!bVar31 * local_e0._16_4_);
      bVar17 = (bool)(bVar74 >> 5 & 1);
      local_3c0._20_4_ =
           (uint)bVar17 * auVar95._20_4_ |
           (uint)!bVar17 * ((uint)bVar48 * auVar100._20_4_ | (uint)!bVar48 * local_e0._20_4_);
      bVar17 = (bool)(bVar74 >> 6 & 1);
      local_3c0._24_4_ =
           (uint)bVar17 * auVar95._24_4_ |
           (uint)!bVar17 * ((uint)bVar41 * auVar100._24_4_ | (uint)!bVar41 * local_e0._24_4_);
      local_3c0._28_4_ =
           (uint)(bVar74 >> 7) * auVar95._28_4_ |
           (uint)!(bool)(bVar74 >> 7) *
           ((uint)bVar51 * auVar100._28_4_ | (uint)!bVar51 * local_e0._28_4_);
      auVar95 = vrcp14ps_avx512vl(auVar101);
      auVar100 = vfnmadd213ps_avx512vl(auVar95,auVar101,auVar134);
      auVar88 = vfmadd132ps_fma(auVar100,auVar95,auVar95);
      auVar141 = ZEXT1664(auVar88);
      iVar161 = (uint)!(bool)(bVar72 & 1) * 0x3f800000;
      iVar162 = (uint)!(bool)((byte)(uVar86 >> 1) & 1) * 0x3f800000;
      iVar163 = (uint)!(bool)((byte)(uVar86 >> 2) & 1) * 0x3f800000;
      iVar164 = (uint)!(bool)((byte)(uVar86 >> 3) & 1) * 0x3f800000;
      iVar165 = (uint)!(bool)((byte)(uVar86 >> 4) & 1) * 0x3f800000;
      iVar166 = (uint)!(bool)((byte)(uVar86 >> 5) & 1) * 0x3f800000;
      iVar167 = (uint)!(bool)((byte)(uVar86 >> 6) & 1) * 0x3f800000;
      iVar168 = (uint)!SUB81(uVar86 >> 7,0) * 0x3f800000;
      auVar95 = vmulps_avx512vl(auVar122,ZEXT1632(auVar88));
      local_460._0_4_ = (uint)(bVar74 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar74 & 1) * iVar161;
      bVar17 = (bool)(bVar74 >> 1 & 1);
      local_460._4_4_ = (uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * iVar162;
      bVar17 = (bool)(bVar74 >> 2 & 1);
      local_460._8_4_ = (uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * iVar163;
      bVar17 = (bool)(bVar74 >> 3 & 1);
      local_460._12_4_ = (uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * iVar164;
      bVar17 = (bool)(bVar74 >> 4 & 1);
      local_460._16_4_ = (uint)bVar17 * auVar95._16_4_ | (uint)!bVar17 * iVar165;
      bVar17 = (bool)(bVar74 >> 5 & 1);
      local_460._20_4_ = (uint)bVar17 * auVar95._20_4_ | (uint)!bVar17 * iVar166;
      bVar17 = (bool)(bVar74 >> 6 & 1);
      local_460._24_4_ = (uint)bVar17 * auVar95._24_4_ | (uint)!bVar17 * iVar167;
      local_460._28_4_ = (uint)(bVar74 >> 7) * auVar95._28_4_ | (uint)!(bool)(bVar74 >> 7) * iVar168
      ;
      local_420._0_4_ = auVar127._0_4_ + auVar121._0_4_;
      local_420._4_4_ = auVar127._4_4_ + auVar121._4_4_;
      local_420._8_4_ = auVar127._8_4_ + auVar121._8_4_;
      local_420._12_4_ = auVar127._12_4_ + auVar121._12_4_;
      local_420._16_4_ = auVar127._16_4_ + auVar121._16_4_;
      local_420._20_4_ = auVar127._20_4_ + auVar121._20_4_;
      local_420._24_4_ = auVar127._24_4_ + auVar121._24_4_;
      local_420._28_4_ = auVar121._28_4_ + 0.0;
      local_440 = ZEXT1232(ZEXT812(0)) << 0x20;
      local_3e0[0] = (uint)(bVar74 & 1) * auVar97._0_4_ |
                     (uint)!(bool)(bVar74 & 1) *
                     ((uint)(bVar72 & 1) * auVar96._0_4_ |
                     (uint)!(bool)(bVar72 & 1) * (int)auVar107._0_4_);
      local_3e0[1] = (uint)bVar82 * auVar97._4_4_ |
                     (uint)!bVar82 *
                     ((uint)bVar81 * auVar96._4_4_ | (uint)!bVar81 * (int)auVar107._4_4_);
      local_3e0[2] = (uint)bVar20 * auVar97._8_4_ |
                     (uint)!bVar20 *
                     ((uint)bVar19 * auVar96._8_4_ | (uint)!bVar19 * (int)auVar107._8_4_);
      local_3e0[3] = (uint)bVar23 * auVar97._12_4_ |
                     (uint)!bVar23 *
                     ((uint)bVar22 * auVar96._12_4_ | (uint)!bVar22 * (int)auVar107._12_4_);
      uStack_3d0 = (uint)bVar30 * auVar97._16_4_ |
                   (uint)!bVar30 *
                   ((uint)bVar25 * auVar96._16_4_ | (uint)!bVar25 * (int)auVar107._16_4_);
      uStack_3cc = (uint)bVar39 * auVar97._20_4_ |
                   (uint)!bVar39 *
                   ((uint)bVar38 * auVar96._20_4_ | (uint)!bVar38 * (int)auVar107._20_4_);
      uStack_3c8 = (uint)bVar40 * auVar97._24_4_ |
                   (uint)!bVar40 *
                   ((uint)bVar49 * auVar96._24_4_ | (uint)!bVar49 * (int)auVar107._24_4_);
      uStack_3c4 = (uint)(bVar74 >> 7) * auVar97._28_4_ |
                   (uint)!(bool)(bVar74 >> 7) *
                   ((uint)bVar50 * auVar96._28_4_ | (uint)!bVar50 * (int)auVar107._28_4_);
      uVar79 = (ulong)(bVar84 & ((byte)uVar87 | bVar83));
      auVar88 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar136 = ZEXT1664(auVar88);
      auVar95 = vpcmpeqd_avx2(local_400,local_400);
      auVar143 = ZEXT3264(auVar95);
      local_588 = ray;
      local_578 = line;
      do {
        local_570.hit = local_4f0;
        local_570.valid = (int *)local_5a0;
        uVar71 = 0;
        for (uVar86 = uVar79; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
          uVar71 = uVar71 + 1;
        }
        pGVar14 = (pSVar13->geometries).items[*(uint *)(local_100 + uVar71 * 4)].ptr;
        if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar79 = uVar79 ^ 1L << (uVar71 & 0x3f);
          bVar81 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar81 = false;
        }
        else {
          uVar86 = (ulong)(uint)((int)uVar71 * 4);
          local_57c = *(undefined4 *)(ray + k * 4 + 0x80);
          uVar3 = *(undefined4 *)(local_460 + uVar86);
          local_4c0._4_4_ = uVar3;
          local_4c0._0_4_ = uVar3;
          local_4c0._8_4_ = uVar3;
          local_4c0._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(local_440 + uVar86);
          local_4b0._4_4_ = uVar3;
          local_4b0._0_4_ = uVar3;
          local_4b0._8_4_ = uVar3;
          local_4b0._12_4_ = uVar3;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_420 + uVar86);
          local_570.context = context->user;
          local_490 = vpbroadcastd_avx512vl();
          uVar3 = *(undefined4 *)((long)&(local_578->primIDs).field_0 + uVar86);
          local_4a0._4_4_ = uVar3;
          local_4a0._0_4_ = uVar3;
          local_4a0._8_4_ = uVar3;
          local_4a0._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(local_400 + uVar86);
          local_4f0._4_4_ = uVar3;
          local_4f0._0_4_ = uVar3;
          local_4f0._8_4_ = uVar3;
          local_4f0._12_4_ = uVar3;
          uVar3 = *(undefined4 *)((long)local_3e0 + uVar86);
          local_4e0._4_4_ = uVar3;
          local_4e0._0_4_ = uVar3;
          local_4e0._8_4_ = uVar3;
          local_4e0._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(local_3c0 + uVar86);
          local_4d0._4_4_ = uVar3;
          local_4d0._0_4_ = uVar3;
          local_4d0._8_4_ = uVar3;
          local_4d0._12_4_ = uVar3;
          uStack_47c = (local_570.context)->instID[0];
          local_480 = uStack_47c;
          uStack_478 = uStack_47c;
          uStack_474 = uStack_47c;
          uStack_470 = (local_570.context)->instPrimID[0];
          uStack_46c = uStack_470;
          uStack_468 = uStack_470;
          uStack_464 = uStack_470;
          local_5a0 = auVar136._0_16_;
          local_570.geometryUserPtr = pGVar14->userPtr;
          local_570.N = 4;
          local_120 = auVar169._0_32_;
          local_140 = auVar170._0_32_;
          local_160 = auVar171._0_32_;
          local_180 = auVar172._0_32_;
          local_1a0 = auVar173._0_32_;
          local_1c0 = auVar174._0_32_;
          local_1e0 = auVar175._0_32_;
          local_200 = auVar176._0_32_;
          local_220 = iVar161;
          iStack_21c = iVar162;
          iStack_218 = iVar163;
          iStack_214 = iVar164;
          iStack_210 = iVar165;
          iStack_20c = iVar166;
          iStack_208 = iVar167;
          iStack_204 = iVar168;
          local_240 = auVar159._0_32_;
          local_260 = auVar155._0_32_;
          local_280 = auVar148._0_32_;
          local_2a0 = auVar156._0_32_;
          local_2c0 = auVar154._0_32_;
          local_2e0 = auVar157._0_32_;
          local_300 = auVar145._0_32_;
          local_320 = auVar152._0_32_;
          local_340 = auVar158._0_32_;
          local_360 = auVar138._0_32_;
          local_380 = auVar141._0_32_;
          local_3a0 = auVar160._0_32_;
          uVar86 = uVar87;
          local_570.ray = (RTCRayN *)ray;
          local_500 = local_5a0;
          if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar95 = ZEXT1632(auVar143._0_16_);
            (*pGVar14->occlusionFilterN)(&local_570);
            auVar95 = vpcmpeqd_avx2(auVar95,auVar95);
            auVar143 = ZEXT3264(auVar95);
            auVar136 = ZEXT1664(local_500);
            auVar160 = ZEXT3264(local_3a0);
            auVar141 = ZEXT3264(local_380);
            auVar138 = ZEXT3264(local_360);
            auVar158 = ZEXT3264(local_340);
            auVar152 = ZEXT3264(local_320);
            auVar145 = ZEXT3264(local_300);
            uVar86 = uVar87 & 0xffff;
            auVar157 = ZEXT3264(local_2e0);
            auVar154 = ZEXT3264(local_2c0);
            auVar156 = ZEXT3264(local_2a0);
            auVar148 = ZEXT3264(local_280);
            auVar155 = ZEXT3264(local_260);
            auVar159 = ZEXT3264(local_240);
            auVar176 = ZEXT3264(local_200);
            auVar175 = ZEXT3264(local_1e0);
            auVar174 = ZEXT3264(local_1c0);
            auVar173 = ZEXT3264(local_1a0);
            auVar172 = ZEXT3264(local_180);
            auVar171 = ZEXT3264(local_160);
            auVar170 = ZEXT3264(local_140);
            auVar169 = ZEXT3264(local_120);
            ray = local_588;
          }
          uVar85 = vptestmd_avx512vl(local_5a0,local_5a0);
          if ((uVar85 & 0xf) == 0) {
            bVar81 = true;
          }
          else {
            p_Var16 = context->args->filter;
            if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
              auVar95 = ZEXT1632(auVar143._0_16_);
              (*p_Var16)(&local_570);
              auVar95 = vpcmpeqd_avx2(auVar95,auVar95);
              auVar143 = ZEXT3264(auVar95);
              auVar136 = ZEXT1664(local_500);
              auVar160 = ZEXT3264(local_3a0);
              auVar141 = ZEXT3264(local_380);
              auVar138 = ZEXT3264(local_360);
              auVar158 = ZEXT3264(local_340);
              auVar152 = ZEXT3264(local_320);
              auVar145 = ZEXT3264(local_300);
              uVar86 = uVar87 & 0xffff;
              auVar157 = ZEXT3264(local_2e0);
              auVar154 = ZEXT3264(local_2c0);
              auVar156 = ZEXT3264(local_2a0);
              auVar148 = ZEXT3264(local_280);
              auVar155 = ZEXT3264(local_260);
              auVar159 = ZEXT3264(local_240);
              auVar176 = ZEXT3264(local_200);
              auVar175 = ZEXT3264(local_1e0);
              auVar174 = ZEXT3264(local_1c0);
              auVar173 = ZEXT3264(local_1a0);
              auVar172 = ZEXT3264(local_180);
              auVar171 = ZEXT3264(local_160);
              auVar170 = ZEXT3264(local_140);
              auVar169 = ZEXT3264(local_120);
            }
            uVar85 = vptestmd_avx512vl(local_5a0,local_5a0);
            uVar85 = uVar85 & 0xf;
            auVar88 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar81 = (bool)((byte)uVar85 & 1);
            auVar89._0_4_ =
                 (uint)bVar81 * auVar88._0_4_ | (uint)!bVar81 * *(int *)(local_570.ray + 0x80);
            bVar81 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar89._4_4_ =
                 (uint)bVar81 * auVar88._4_4_ | (uint)!bVar81 * *(int *)(local_570.ray + 0x84);
            bVar81 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar89._8_4_ =
                 (uint)bVar81 * auVar88._8_4_ | (uint)!bVar81 * *(int *)(local_570.ray + 0x88);
            bVar81 = SUB81(uVar85 >> 3,0);
            auVar89._12_4_ =
                 (uint)bVar81 * auVar88._12_4_ | (uint)!bVar81 * *(int *)(local_570.ray + 0x8c);
            *(undefined1 (*) [16])(local_570.ray + 0x80) = auVar89;
            bVar81 = (byte)uVar85 == 0;
          }
          uVar87 = uVar86;
          iVar161 = local_220;
          iVar162 = iStack_21c;
          iVar163 = iStack_218;
          iVar164 = iStack_214;
          iVar165 = iStack_210;
          iVar166 = iStack_20c;
          iVar167 = iStack_208;
          iVar168 = iStack_204;
          if (bVar81 != false) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_57c;
            uVar79 = uVar79 ^ 1L << (uVar71 & 0x3f);
          }
        }
      } while ((uVar79 != 0) && (bVar81 != false));
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar75._4_4_ = uVar3;
      auVar75._0_4_ = uVar3;
      auVar75._8_4_ = uVar3;
      auVar75._12_4_ = uVar3;
      auVar75._16_4_ = uVar3;
      auVar75._20_4_ = uVar3;
      auVar75._24_4_ = uVar3;
      auVar75._28_4_ = uVar3;
      uVar67 = vcmpps_avx512vl(auVar148._0_32_,auVar75,2);
      bVar84 = (byte)uVar87 & (byte)uVar67;
      if ((bVar84 & bVar73) == 0) {
        return (bool)(bVar81 ^ 1U);
      }
      auVar97 = auVar154._0_32_;
      uVar67 = vcmpps_avx512vl(auVar97,auVar156._0_32_,0);
      uVar68 = vcmpps_avx512vl(auVar97,auVar157._0_32_,0);
      bVar83 = (byte)uVar67 | (byte)uVar68;
      uVar79 = vcmpps_avx512vl(auVar97,auVar155._0_32_,0);
      auVar95 = vmulps_avx512vl(auVar169._0_32_,auVar97);
      auVar96 = vmulps_avx512vl(auVar170._0_32_,auVar97);
      auVar97 = vmulps_avx512vl(auVar171._0_32_,auVar97);
      auVar125._0_4_ = auVar95._0_4_ + (float)local_520._0_4_;
      auVar125._4_4_ = auVar95._4_4_ + (float)local_520._4_4_;
      auVar125._8_4_ = auVar95._8_4_ + fStack_518;
      auVar125._12_4_ = auVar95._12_4_ + fStack_514;
      auVar125._16_4_ = auVar95._16_4_ + fStack_510;
      auVar125._20_4_ = auVar95._20_4_ + fStack_50c;
      auVar125._24_4_ = auVar95._24_4_ + fStack_508;
      auVar125._28_4_ = auVar95._28_4_ + fStack_504;
      auVar128._0_4_ = auVar96._0_4_ + (float)local_540._0_4_;
      auVar128._4_4_ = auVar96._4_4_ + (float)local_540._4_4_;
      auVar128._8_4_ = auVar96._8_4_ + fStack_538;
      auVar128._12_4_ = auVar96._12_4_ + fStack_534;
      auVar128._16_4_ = auVar96._16_4_ + fStack_530;
      auVar128._20_4_ = auVar96._20_4_ + fStack_52c;
      auVar128._24_4_ = auVar96._24_4_ + fStack_528;
      auVar128._28_4_ = auVar96._28_4_ + fStack_524;
      auVar95 = vaddps_avx512vl(auVar175._0_32_,auVar97);
      auVar100 = auVar176._0_32_;
      auVar96 = vmulps_avx512vl(auVar100,auVar125);
      auVar97 = vmulps_avx512vl(auVar100,auVar128);
      auVar95 = vmulps_avx512vl(auVar100,auVar95);
      auVar126._0_4_ = auVar145._0_4_ + auVar96._0_4_;
      auVar126._4_4_ = auVar145._4_4_ + auVar96._4_4_;
      auVar126._8_4_ = auVar145._8_4_ + auVar96._8_4_;
      auVar126._12_4_ = auVar145._12_4_ + auVar96._12_4_;
      auVar126._16_4_ = auVar145._16_4_ + auVar96._16_4_;
      auVar126._20_4_ = auVar145._20_4_ + auVar96._20_4_;
      auVar126._24_4_ = auVar145._24_4_ + auVar96._24_4_;
      auVar126._28_4_ = auVar145._28_4_ + auVar96._28_4_;
      auVar129._0_4_ = auVar152._0_4_ + auVar97._0_4_;
      auVar129._4_4_ = auVar152._4_4_ + auVar97._4_4_;
      auVar129._8_4_ = auVar152._8_4_ + auVar97._8_4_;
      auVar129._12_4_ = auVar152._12_4_ + auVar97._12_4_;
      auVar129._16_4_ = auVar152._16_4_ + auVar97._16_4_;
      auVar129._20_4_ = auVar152._20_4_ + auVar97._20_4_;
      auVar129._24_4_ = auVar152._24_4_ + auVar97._24_4_;
      auVar129._28_4_ = auVar152._28_4_ + auVar97._28_4_;
      auVar95 = vaddps_avx512vl(auVar158._0_32_,auVar95);
      auVar123 = auVar159._0_32_;
      auVar96 = vmulps_avx512vl(auVar123,local_80);
      auVar97 = vmulps_avx512vl(auVar123,local_a0);
      auVar105 = auVar138._0_32_;
      auVar100 = vmulps_avx512vl(auVar105,auVar123);
      bVar72 = (byte)uVar79;
      bVar82 = (bool)((byte)(uVar79 >> 1) & 1);
      bVar22 = (bool)((byte)(uVar79 >> 2) & 1);
      bVar38 = (bool)((byte)(uVar79 >> 3) & 1);
      bVar50 = (bool)((byte)(uVar79 >> 4) & 1);
      bVar32 = (bool)((byte)(uVar79 >> 5) & 1);
      bVar42 = (bool)((byte)(uVar79 >> 6) & 1);
      bVar52 = SUB81(uVar79 >> 7,0);
      bVar17 = (bool)((byte)(uVar79 >> 1) & 1);
      bVar23 = (bool)((byte)(uVar79 >> 2) & 1);
      bVar39 = (bool)((byte)(uVar79 >> 3) & 1);
      bVar51 = (bool)((byte)(uVar79 >> 4) & 1);
      bVar33 = (bool)((byte)(uVar79 >> 5) & 1);
      bVar43 = (bool)((byte)(uVar79 >> 6) & 1);
      bVar53 = SUB81(uVar79 >> 7,0);
      bVar18 = (bool)((byte)(uVar79 >> 1) & 1);
      bVar24 = (bool)((byte)(uVar79 >> 2) & 1);
      bVar48 = (bool)((byte)(uVar79 >> 3) & 1);
      bVar26 = (bool)((byte)(uVar79 >> 4) & 1);
      bVar34 = (bool)((byte)(uVar79 >> 5) & 1);
      bVar44 = (bool)((byte)(uVar79 >> 6) & 1);
      bVar54 = SUB81(uVar79 >> 7,0);
      auVar96 = vsubps_avx512vl(auVar126,auVar96);
      bVar19 = (bool)(bVar83 >> 1 & 1);
      bVar25 = (bool)(bVar83 >> 2 & 1);
      bVar49 = (bool)(bVar83 >> 3 & 1);
      bVar27 = (bool)(bVar83 >> 4 & 1);
      bVar35 = (bool)(bVar83 >> 5 & 1);
      bVar45 = (bool)(bVar83 >> 6 & 1);
      auVar97 = vsubps_avx512vl(auVar129,auVar97);
      bVar20 = (bool)(bVar83 >> 1 & 1);
      bVar30 = (bool)(bVar83 >> 2 & 1);
      bVar40 = (bool)(bVar83 >> 3 & 1);
      bVar28 = (bool)(bVar83 >> 4 & 1);
      bVar36 = (bool)(bVar83 >> 5 & 1);
      bVar46 = (bool)(bVar83 >> 6 & 1);
      auVar123 = vmulps_avx512vl(auVar123,auVar141._0_32_);
      bVar21 = (bool)(bVar83 >> 1 & 1);
      bVar31 = (bool)(bVar83 >> 2 & 1);
      bVar41 = (bool)(bVar83 >> 3 & 1);
      bVar29 = (bool)(bVar83 >> 4 & 1);
      bVar37 = (bool)(bVar83 >> 5 & 1);
      bVar47 = (bool)(bVar83 >> 6 & 1);
      local_460._4_4_ = (uint)bVar21 * auVar123._4_4_ | (uint)!bVar21 * iVar162;
      local_460._0_4_ = (uint)(bVar83 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar83 & 1) * iVar161;
      local_460._8_4_ = (uint)bVar31 * auVar123._8_4_ | (uint)!bVar31 * iVar163;
      local_460._12_4_ = (uint)bVar41 * auVar123._12_4_ | (uint)!bVar41 * iVar164;
      local_460._16_4_ = (uint)bVar29 * auVar123._16_4_ | (uint)!bVar29 * iVar165;
      local_460._20_4_ = (uint)bVar37 * auVar123._20_4_ | (uint)!bVar37 * iVar166;
      local_460._24_4_ = (uint)bVar47 * auVar123._24_4_ | (uint)!bVar47 * iVar167;
      local_460._28_4_ =
           (uint)(bVar83 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar83 >> 7) * iVar168;
      local_440 = ZEXT432(0) << 0x20;
      local_420 = auVar148._0_32_;
      local_400._4_4_ =
           (uint)bVar19 * auVar96._4_4_ |
           (uint)!bVar19 * ((uint)bVar82 * local_c0._4_4_ | (uint)!bVar82 * auVar174._4_4_);
      local_400._0_4_ =
           (uint)(bVar83 & 1) * auVar96._0_4_ |
           (uint)!(bool)(bVar83 & 1) *
           ((uint)(bVar72 & 1) * local_c0._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar174._0_4_);
      local_400._8_4_ =
           (uint)bVar25 * auVar96._8_4_ |
           (uint)!bVar25 * ((uint)bVar22 * local_c0._8_4_ | (uint)!bVar22 * auVar174._8_4_);
      local_400._12_4_ =
           (uint)bVar49 * auVar96._12_4_ |
           (uint)!bVar49 * ((uint)bVar38 * local_c0._12_4_ | (uint)!bVar38 * auVar174._12_4_);
      local_400._16_4_ =
           (uint)bVar27 * auVar96._16_4_ |
           (uint)!bVar27 * ((uint)bVar50 * local_c0._16_4_ | (uint)!bVar50 * auVar174._16_4_);
      local_400._20_4_ =
           (uint)bVar35 * auVar96._20_4_ |
           (uint)!bVar35 * ((uint)bVar32 * local_c0._20_4_ | (uint)!bVar32 * auVar174._20_4_);
      local_400._24_4_ =
           (uint)bVar45 * auVar96._24_4_ |
           (uint)!bVar45 * ((uint)bVar42 * local_c0._24_4_ | (uint)!bVar42 * auVar174._24_4_);
      local_400._28_4_ =
           (uint)(bVar83 >> 7) * auVar96._28_4_ |
           (uint)!(bool)(bVar83 >> 7) *
           ((uint)bVar52 * local_c0._28_4_ | (uint)!bVar52 * auVar174._28_4_);
      auVar95 = vsubps_avx512vl(auVar95,auVar100);
      local_3c0._0_4_ =
           (uint)(bVar83 & 1) * auVar95._0_4_ |
           (uint)!(bool)(bVar83 & 1) *
           ((uint)(bVar72 & 1) * local_e0._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar173._0_4_);
      bVar82 = (bool)(bVar83 >> 1 & 1);
      local_3c0._4_4_ =
           (uint)bVar82 * auVar95._4_4_ |
           (uint)!bVar82 * ((uint)bVar18 * local_e0._4_4_ | (uint)!bVar18 * auVar173._4_4_);
      bVar82 = (bool)(bVar83 >> 2 & 1);
      local_3c0._8_4_ =
           (uint)bVar82 * auVar95._8_4_ |
           (uint)!bVar82 * ((uint)bVar24 * local_e0._8_4_ | (uint)!bVar24 * auVar173._8_4_);
      bVar82 = (bool)(bVar83 >> 3 & 1);
      local_3c0._12_4_ =
           (uint)bVar82 * auVar95._12_4_ |
           (uint)!bVar82 * ((uint)bVar48 * local_e0._12_4_ | (uint)!bVar48 * auVar173._12_4_);
      bVar82 = (bool)(bVar83 >> 4 & 1);
      local_3c0._16_4_ =
           (uint)bVar82 * auVar95._16_4_ |
           (uint)!bVar82 * ((uint)bVar26 * local_e0._16_4_ | (uint)!bVar26 * auVar173._16_4_);
      bVar82 = (bool)(bVar83 >> 5 & 1);
      local_3c0._20_4_ =
           (uint)bVar82 * auVar95._20_4_ |
           (uint)!bVar82 * ((uint)bVar34 * local_e0._20_4_ | (uint)!bVar34 * auVar173._20_4_);
      bVar82 = (bool)(bVar83 >> 6 & 1);
      local_3c0._24_4_ =
           (uint)bVar82 * auVar95._24_4_ |
           (uint)!bVar82 * ((uint)bVar44 * local_e0._24_4_ | (uint)!bVar44 * auVar173._24_4_);
      local_3c0._28_4_ =
           (uint)(bVar83 >> 7) * auVar95._28_4_ |
           (uint)!(bool)(bVar83 >> 7) *
           ((uint)bVar54 * local_e0._28_4_ | (uint)!bVar54 * auVar173._28_4_);
      local_3e0[0] = (uint)(bVar83 & 1) * auVar97._0_4_ |
                     (uint)!(bool)(bVar83 & 1) *
                     ((uint)(bVar72 & 1) * auVar160._0_4_ |
                     (uint)!(bool)(bVar72 & 1) * auVar172._0_4_);
      local_3e0[1] = (uint)bVar20 * auVar97._4_4_ |
                     (uint)!bVar20 *
                     ((uint)bVar17 * auVar160._4_4_ | (uint)!bVar17 * auVar172._4_4_);
      local_3e0[2] = (uint)bVar30 * auVar97._8_4_ |
                     (uint)!bVar30 *
                     ((uint)bVar23 * auVar160._8_4_ | (uint)!bVar23 * auVar172._8_4_);
      local_3e0[3] = (uint)bVar40 * auVar97._12_4_ |
                     (uint)!bVar40 *
                     ((uint)bVar39 * auVar160._12_4_ | (uint)!bVar39 * auVar172._12_4_);
      uStack_3d0 = (uint)bVar28 * auVar97._16_4_ |
                   (uint)!bVar28 *
                   ((uint)bVar51 * auVar160._16_4_ | (uint)!bVar51 * auVar172._16_4_);
      uStack_3cc = (uint)bVar36 * auVar97._20_4_ |
                   (uint)!bVar36 *
                   ((uint)bVar33 * auVar160._20_4_ | (uint)!bVar33 * auVar172._20_4_);
      uStack_3c8 = (uint)bVar46 * auVar97._24_4_ |
                   (uint)!bVar46 *
                   ((uint)bVar43 * auVar160._24_4_ | (uint)!bVar43 * auVar172._24_4_);
      uStack_3c4 = (uint)(bVar83 >> 7) * auVar97._28_4_ |
                   (uint)!(bool)(bVar83 >> 7) *
                   ((uint)bVar53 * auVar160._28_4_ | (uint)!bVar53 * auVar172._28_4_);
      auVar80 = (undefined1  [8])context->scene;
      uVar79 = (ulong)(bVar84 & bVar73);
      auVar88 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar169 = ZEXT1664(auVar88);
      auVar95 = vpcmpeqd_avx2(auVar105,auVar105);
      auVar170 = ZEXT3264(auVar95);
      do {
        local_570.hit = local_4f0;
        local_570.valid = (int *)local_5a0;
        uVar71 = 0;
        for (uVar86 = uVar79; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
          uVar71 = uVar71 + 1;
        }
        pGVar14 = (((Scene *)auVar80)->geometries).items[*(uint *)(local_100 + uVar71 * 4)].ptr;
        if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar79 = uVar79 ^ 1L << (uVar71 & 0x3f);
          bVar82 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar82 = false;
        }
        else {
          uVar86 = (ulong)(uint)((int)uVar71 * 4);
          uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
          uVar4 = *(undefined4 *)(local_460 + uVar86);
          local_4c0._4_4_ = uVar4;
          local_4c0._0_4_ = uVar4;
          local_4c0._8_4_ = uVar4;
          local_4c0._12_4_ = uVar4;
          uVar4 = *(undefined4 *)(local_440 + uVar86);
          local_4b0._4_4_ = uVar4;
          local_4b0._0_4_ = uVar4;
          local_4b0._8_4_ = uVar4;
          local_4b0._12_4_ = uVar4;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_420 + uVar86);
          local_570.context = context->user;
          local_490 = vpbroadcastd_avx512vl();
          uVar4 = *(undefined4 *)((long)&(local_578->primIDs).field_0 + uVar86);
          local_4a0._4_4_ = uVar4;
          local_4a0._0_4_ = uVar4;
          local_4a0._8_4_ = uVar4;
          local_4a0._12_4_ = uVar4;
          uVar4 = *(undefined4 *)(local_400 + uVar86);
          local_4f0._4_4_ = uVar4;
          local_4f0._0_4_ = uVar4;
          local_4f0._8_4_ = uVar4;
          local_4f0._12_4_ = uVar4;
          uVar4 = *(undefined4 *)((long)local_3e0 + uVar86);
          local_4e0._4_4_ = uVar4;
          local_4e0._0_4_ = uVar4;
          local_4e0._8_4_ = uVar4;
          local_4e0._12_4_ = uVar4;
          uVar4 = *(undefined4 *)(local_3c0 + uVar86);
          local_4d0._4_4_ = uVar4;
          local_4d0._0_4_ = uVar4;
          local_4d0._8_4_ = uVar4;
          local_4d0._12_4_ = uVar4;
          uStack_47c = (local_570.context)->instID[0];
          local_480 = uStack_47c;
          uStack_478 = uStack_47c;
          uStack_474 = uStack_47c;
          uStack_470 = (local_570.context)->instPrimID[0];
          uStack_46c = uStack_470;
          uStack_468 = uStack_470;
          uStack_464 = uStack_470;
          local_5a0 = auVar169._0_16_;
          local_570.geometryUserPtr = pGVar14->userPtr;
          local_570.N = 4;
          local_520 = auVar80;
          _local_540 = local_5a0;
          local_570.ray = (RTCRayN *)ray;
          if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar95 = ZEXT1632(auVar170._0_16_);
            (*pGVar14->occlusionFilterN)(&local_570);
            auVar95 = vpcmpeqd_avx2(auVar95,auVar95);
            auVar170 = ZEXT3264(auVar95);
            auVar169 = ZEXT1664(_local_540);
            ray = local_588;
            auVar80 = local_520;
          }
          uVar86 = vptestmd_avx512vl(local_5a0,local_5a0);
          if ((uVar86 & 0xf) == 0) {
            bVar82 = true;
          }
          else {
            p_Var16 = context->args->filter;
            if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
              auVar95 = ZEXT1632(auVar170._0_16_);
              (*p_Var16)(&local_570);
              auVar95 = vpcmpeqd_avx2(auVar95,auVar95);
              auVar170 = ZEXT3264(auVar95);
              auVar169 = ZEXT1664(_local_540);
              ray = local_588;
              auVar80 = local_520;
            }
            uVar86 = vptestmd_avx512vl(local_5a0,local_5a0);
            uVar86 = uVar86 & 0xf;
            auVar88 = *(undefined1 (*) [16])(local_570.ray + 0x80);
            auVar89 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar82 = (bool)((byte)uVar86 & 1);
            auVar90._0_4_ = (uint)bVar82 * auVar89._0_4_ | (uint)!bVar82 * auVar88._0_4_;
            bVar82 = (bool)((byte)(uVar86 >> 1) & 1);
            auVar90._4_4_ = (uint)bVar82 * auVar89._4_4_ | (uint)!bVar82 * auVar88._4_4_;
            bVar82 = (bool)((byte)(uVar86 >> 2) & 1);
            auVar90._8_4_ = (uint)bVar82 * auVar89._8_4_ | (uint)!bVar82 * auVar88._8_4_;
            bVar82 = SUB81(uVar86 >> 3,0);
            auVar90._12_4_ = (uint)bVar82 * auVar89._12_4_ | (uint)!bVar82 * auVar88._12_4_;
            *(undefined1 (*) [16])(local_570.ray + 0x80) = auVar90;
            bVar82 = (byte)uVar86 == 0;
          }
          if (bVar82 != false) {
            *(undefined4 *)(ray + k * 4 + 0x80) = uVar3;
            uVar79 = uVar79 ^ 1L << (uVar71 & 0x3f);
          }
        }
      } while ((uVar79 != 0) && (bVar82 != false));
      return (bool)(bVar81 ^ 1U | bVar82 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }